

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptConversion.cpp
# Opt level: O1

int32 Js::JavascriptConversion::ToInt32_Full(Var aValue,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  BOOL BVar4;
  int32 iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  JavascriptBoolean *pJVar8;
  JavascriptTypedNumber<unsigned_long> *pJVar9;
  JavascriptTypedNumber<long> *pJVar10;
  JavascriptString *pJVar11;
  int32 T4_32;
  uint uVar12;
  ulong uVar13;
  Type TVar14;
  bool bVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double local_58;
  double result;
  ScriptContext *local_48;
  
  local_48 = scriptContext;
  bVar2 = JavascriptStackWalker::ValidateTopJitFrame(scriptContext);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x3ca,
                                "(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext))",
                                "Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext)");
    if (!bVar2) goto LAB_00a9ac8e;
    *puVar6 = 0;
  }
  uVar13 = (ulong)aValue & 0xffff000000000000;
  bVar2 = uVar13 == 0x1000000000000;
  bVar15 = ((ulong)aValue & 0x1ffff00000000) != 0x1000000000000;
  if (bVar15 && bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a9ac8e;
    *puVar6 = 0;
  }
  if (uVar13 == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                ,0x3cb,"(!TaggedInt::Is(aValue))","Should be detected");
    if (!bVar3) goto LAB_00a9ac8e;
    *puVar6 = 0;
  }
  bVar3 = VarIs<Js::RecyclableObject>(aValue);
  if (bVar3) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    result = (double)(((((pRVar7->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                     scriptContext.ptr;
  }
  else {
    result = 0.0;
  }
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00a9ac8e;
    *puVar6 = 0;
  }
  if (bVar15 && bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00a9ac8e;
    *puVar6 = 0;
  }
  TVar14 = TypeIds_FirstNumberType;
  if ((uVar13 != 0x1000000000000) && (TVar14 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00a9ac8e;
      *puVar6 = 0;
    }
    TVar14 = ((pRVar7->type).ptr)->typeId;
    if ((0x57 < (int)TVar14) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00a9ac8e;
      *puVar6 = 0;
    }
  }
  uVar12 = 0;
  switch(TVar14) {
  case TypeIds_Undefined:
  case TypeIds_Null:
    break;
  case TypeIds_Boolean:
LAB_00a9a6cf:
    pJVar8 = UnsafeVarTo<Js::JavascriptBoolean>(aValue);
    uVar12 = (uint)(pJVar8->value != 0);
    break;
  case TypeIds_FirstNumberType:
    if (bVar15 && bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a9ac8e;
      *puVar6 = 0;
    }
    if (uVar13 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x43,"(Is(aValue))","Ensure var is actually a \'TaggedInt\'");
      if (!bVar2) goto LAB_00a9ac8e;
      *puVar6 = 0;
    }
    uVar12 = (uint)aValue;
    break;
  case TypeIds_Number:
    if ((ulong)aValue >> 0x32 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                  ,0xd4,"(Is(aValue))",
                                  "Ensure var is actually a \'JavascriptNumber\'");
      if (!bVar2) goto LAB_00a9ac8e;
      *puVar6 = 0;
    }
    local_58 = (double)((ulong)aValue ^ 0xfffc000000000000);
    goto LAB_00a9a8b1;
  case TypeIds_Int64Number:
    pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
    uVar12 = (uint)pJVar10->m_value;
    break;
  case TypeIds_LastNumberType:
    pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
    uVar12 = (uint)pJVar9->m_value;
    break;
  case TypeIds_String:
    pJVar11 = UnsafeVarTo<Js::JavascriptString>(aValue);
    bVar2 = JavascriptString::ToDouble(pJVar11,&local_58);
    if (!bVar2) {
      return 0;
    }
LAB_00a9a8b1:
    uVar12 = (uint)local_58;
    break;
  case TypeIds_Symbol:
switchD_00a9a6ca_caseD_8:
    uVar12 = 0;
    JavascriptError::TryThrowTypeError((ScriptContext *)result,local_48,-0x7ff5ec77,(PCWSTR)0x0);
    break;
  default:
    BVar4 = JavascriptOperators::IsObject(aValue);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x3fd,"(JavascriptOperators::IsObject(aValue))",
                                  "bad type object in conversion ToInteger32");
      if (!bVar2) goto LAB_00a9ac8e;
      *puVar6 = 0;
    }
    aValue = ToPrimitive<(Js::JavascriptHint)2>(aValue,local_48);
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00a9ac8e;
      *puVar6 = 0;
    }
    if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00a9ac8e;
      *puVar6 = 0;
    }
    TVar14 = TypeIds_FirstNumberType;
    if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
       (TVar14 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
      pRVar7 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (pRVar7 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00a9ac8e;
        *puVar6 = 0;
      }
      TVar14 = ((pRVar7->type).ptr)->typeId;
      if ((0x57 < (int)TVar14) && (BVar4 = RecyclableObject::IsExternal(pRVar7), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00a9ac8e;
        *puVar6 = 0;
      }
    }
    switch(TVar14) {
    case TypeIds_Undefined:
    case TypeIds_Null:
      break;
    case TypeIds_Boolean:
      goto LAB_00a9a6cf;
    case TypeIds_FirstNumberType:
      iVar5 = TaggedInt::ToInt32(aValue);
      return iVar5;
    case TypeIds_Number:
      dVar16 = JavascriptNumber::GetValue(aValue);
      iVar5 = ToInt32(dVar16);
      return iVar5;
    case TypeIds_Int64Number:
      pJVar10 = UnsafeVarTo<Js::JavascriptTypedNumber<long>>(aValue);
      dVar16 = (double)pJVar10->m_value;
      goto LAB_00a9ac1a;
    case TypeIds_LastNumberType:
      pJVar9 = UnsafeVarTo<Js::JavascriptTypedNumber<unsigned_long>>(aValue);
      auVar17._0_8_ = (double)CONCAT44(0x43300000,(int)pJVar9->m_value);
      auVar17._8_4_ = (int)(pJVar9->m_value >> 0x20);
      auVar17._12_4_ = 0x45300000;
      dVar16 = (auVar17._0_8_ - 4503599627370496.0) + (auVar17._8_8_ - 1.9342813113834067e+25);
LAB_00a9ac1a:
      iVar5 = JavascriptMath::ToInt32Core(dVar16);
      return iVar5;
    case TypeIds_String:
      pJVar11 = UnsafeVarTo<Js::JavascriptString>(aValue);
      bVar2 = JavascriptString::ToDouble(pJVar11,&local_58);
      uVar12 = 0;
      if (bVar2) {
        uVar12 = ToInt32(local_58);
      }
      break;
    case TypeIds_Symbol:
      goto switchD_00a9a6ca_caseD_8;
    default:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptConversion.cpp"
                                  ,0x429,"(0)",
                                  "wrong call in ToInteger32_Full, no dynamic objects should get here."
                                 );
      if (bVar2) {
        *puVar6 = 0;
        JavascriptError::ThrowError(local_48,-0x7ff5fe4a,(PCWSTR)0x0);
      }
LAB_00a9ac8e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return uVar12;
}

Assistant:

int32 JavascriptConversion::ToInt32_Full(Var aValue, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Conv_ToInt32_Full);
        Assert(Js::JavascriptStackWalker::ValidateTopJitFrame(scriptContext));
        AssertMsg(!TaggedInt::Is(aValue), "Should be detected");

        ScriptContext * objectScriptContext = VarIs<RecyclableObject>(aValue) ? UnsafeVarTo<RecyclableObject>(aValue)->GetScriptContext() : nullptr;
        // This is used when TaggedInt's overflow but remain under int32
        // so Number is our most critical case:

        TypeId typeId = JavascriptOperators::GetTypeId(aValue);

        if (typeId == TypeIds_Number)
        {
            return JavascriptMath::ToInt32Core(JavascriptNumber::GetValue(aValue));
        }

        switch (typeId)
        {
        case TypeIds_Symbol:
            JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
            // Fallthrough to return 0 if exceptions are disabled
        case TypeIds_Undefined:
        case TypeIds_Null:
            return  0;

        case TypeIds_Integer:
            return TaggedInt::ToInt32(aValue);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

        case TypeIds_Int64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue());

        case TypeIds_UInt64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue());

        case TypeIds_String:
        {
            double result;
            if (UnsafeVarTo<JavascriptString>(aValue)->ToDouble(&result))
            {
                return JavascriptMath::ToInt32Core(result);
            }
            // If the string isn't a valid number, ToDouble returns NaN, and ToInt32 of that is 0
            return 0;
        }

        default:
            AssertMsg(JavascriptOperators::IsObject(aValue), "bad type object in conversion ToInteger32");
            aValue = ToPrimitive<JavascriptHint::HintNumber>(aValue, scriptContext);
        }

        switch (JavascriptOperators::GetTypeId(aValue))
        {
        case TypeIds_Symbol:
            JavascriptError::TryThrowTypeError(objectScriptContext, scriptContext, JSERR_NeedNumber);
            // Fallthrough to return 0 if exceptions are disabled
        case TypeIds_Undefined:
        case TypeIds_Null:
            return  0;

        case TypeIds_Integer:
            return TaggedInt::ToInt32(aValue);

        case TypeIds_Boolean:
            return UnsafeVarTo<JavascriptBoolean>(aValue)->GetValue() ? 1 : +0;

        case TypeIds_Number:
            return ToInt32(JavascriptNumber::GetValue(aValue));

        case TypeIds_Int64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptInt64Number>(aValue)->GetValue());

        case TypeIds_UInt64Number:
            // we won't lose precision if the int64 is within 32bit boundary; otherwise we need to
            // treat it as double anyhow.
            return JavascriptMath::ToInt32Core((double)UnsafeVarTo<JavascriptUInt64Number>(aValue)->GetValue());

        case TypeIds_String:
        {
            double result;
            if (UnsafeVarTo<JavascriptString>(aValue)->ToDouble(&result))
            {
                return ToInt32(result);
            }
            // If the string isn't a valid number, ToDouble returns NaN, and ToInt32 of that is 0
            return 0;
        }

        default:
            AssertMsg(FALSE, "wrong call in ToInteger32_Full, no dynamic objects should get here.");
            JavascriptError::ThrowError(scriptContext, VBSERR_OLENoPropOrMethod);
        }
        JIT_HELPER_END(Conv_ToInt32_Full);
    }